

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall
QTreeViewPrivate::select
          (QTreeViewPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  QTreeViewItem *pQVar1;
  int iVar2;
  int iVar3;
  QAbstractItemView *this_00;
  QTreeViewItem *pQVar4;
  QAbstractItemModel *pQVar5;
  QPersistentModelIndex QVar6;
  QPersistentModelIndex QVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  QItemSelectionModel *pQVar13;
  pair<int,_int> *ppVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  undefined4 in_register_00000034;
  QArrayDataPointer<QItemSelectionRange> *this_01;
  ulong uVar19;
  long in_FS_OFFSET;
  QModelIndex ret;
  QModelIndex local_178;
  QModelIndex local_158;
  QPersistentModelIndex local_138;
  QPersistentModelIndex QStack_130;
  undefined8 local_128;
  QPersistentModelIndexData *pQStack_120;
  QAbstractItemModel *local_118;
  undefined8 local_108;
  QPersistentModelIndexData *pQStack_100;
  QAbstractItemModel *local_f8;
  undefined8 local_e8;
  QPersistentModelIndexData *pQStack_e0;
  QAbstractItemModel *local_d8;
  QArrayDataPointer<QItemSelectionRange> local_c8;
  QItemSelectionRange local_a8;
  QPersistentModelIndexData *local_98;
  QPersistentModelIndexData *pQStack_90;
  QAbstractItemModel *pQStack_88;
  QList<std::pair<int,_int>_> local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  uVar9 = viewIndex(this,(QModelIndex *)CONCAT44(in_register_00000034,__nfds));
  iVar10 = viewIndex(this,(QModelIndex *)__readfds);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  columnRanges(&local_78,this,(QModelIndex *)CONCAT44(in_register_00000034,__nfds),
               (QModelIndex *)__readfds);
  if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
    ppVar14 = local_78.d.ptr;
    do {
      iVar2 = ppVar14->first;
      iVar3 = ppVar14->second;
      local_98 = (QPersistentModelIndexData *)0xffffffffffffffff;
      pQStack_90 = (QPersistentModelIndexData *)0x0;
      pQStack_88 = (QAbstractItemModel *)0x0;
      local_a8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex(&local_a8.tl);
      QPersistentModelIndex::QPersistentModelIndex(&local_a8.br);
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (QItemSelectionRange *)0x0;
      local_c8.size = 0;
      uVar16 = uVar9;
      if ((int)uVar9 <= iVar10) {
        do {
          if (((int)uVar16 < 0) ||
             (uVar19 = (ulong)uVar16, (ulong)(this->viewItems).d.size <= uVar19)) {
            local_e8 = (QPersistentModelIndexData *)0xffffffffffffffff;
            pQStack_e0 = (QPersistentModelIndexData *)0x0;
            local_d8 = (QAbstractItemModel *)0x0;
LAB_005a5a65:
            local_108 = (undefined1 *)0xffffffffffffffff;
            pQStack_100 = (QPersistentModelIndexData *)0x0;
            local_f8 = (QAbstractItemModel *)0x0;
          }
          else {
            pQVar4 = (this->viewItems).d.ptr;
            pQVar1 = pQVar4 + uVar19;
            local_e8 = *(QPersistentModelIndexData **)&pQVar1->index;
            pQStack_e0 = (QPersistentModelIndexData *)(pQVar1->index).i;
            local_d8 = pQVar4[uVar19].index.m.ptr;
            local_f8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_108 = &DAT_aaaaaaaaaaaaaaaa;
            pQStack_100 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            if (local_d8 == (QAbstractItemModel *)0x0) goto LAB_005a5a65;
            (**(code **)(*(long *)local_d8 + 0x68))(&local_108,local_d8,&local_e8);
          }
          local_118 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_120 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          if (pQStack_88 == (QAbstractItemModel *)0x0) {
            local_128 = (undefined1 *)0xffffffffffffffff;
            pQStack_120 = (QPersistentModelIndexData *)0x0;
            local_118 = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)pQStack_88 + 0x68))(&local_128,pQStack_88,&local_98);
          }
          uVar17 = uVar16;
          if ((((int)local_98 < 0) || ((long)local_98 < 0)) ||
             (pQStack_88 == (QAbstractItemModel *)0x0)) {
LAB_005a5b9b:
            bVar8 = QItemSelectionRange::isValid(&local_a8);
            if (bVar8) {
              QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                        ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_a8)
              ;
              QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
            }
            if (local_c8.size == 0) {
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_158._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_158.i = 0;
                local_158.m.ptr = (QAbstractItemModel *)0x0;
LAB_005a5cea:
                local_178._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_178.i = 0;
                local_178.m.ptr = (QAbstractItemModel *)0x0;
              }
              else {
                uVar19 = (ulong)local_e8 & 0xffffffff;
                if (local_e8._4_4_ == iVar2) {
                  local_158.m.ptr = local_d8;
                  local_158._0_8_ = local_e8;
                  local_158.i = (quintptr)pQStack_e0;
                }
                else {
                  (**(code **)(*(long *)local_d8 + 0x70))
                            (&local_158,local_d8,uVar19,iVar2,&local_e8);
                  if (local_d8 == (QAbstractItemModel *)0x0) goto LAB_005a5cea;
                  uVar19 = (ulong)local_e8 & 0xffffffff;
                }
                if (local_e8._4_4_ == iVar3) {
                  local_178.m.ptr = local_d8;
                  local_178._0_8_ = local_e8;
                  local_178.i = (quintptr)pQStack_e0;
                }
                else {
                  (**(code **)(*(long *)local_d8 + 0x70))
                            (&local_178,local_d8,uVar19,iVar3,&local_e8);
                }
              }
              QPersistentModelIndex::QPersistentModelIndex(&local_138,&local_158);
              QPersistentModelIndex::QPersistentModelIndex(&QStack_130,&local_178);
              QVar7.d = local_a8.br.d;
              QVar6.d = local_a8.tl.d;
              local_a8.tl.d = local_138.d;
              local_a8.br.d = QStack_130.d;
              local_138.d = QVar6.d;
              QStack_130.d = QVar7.d;
              QPersistentModelIndex::~QPersistentModelIndex(&QStack_130);
              QPersistentModelIndex::~QPersistentModelIndex(&local_138);
            }
            else {
              QList<QItemSelectionRange>::takeLast((QList<QItemSelectionRange> *)&local_158);
              QVar7.d = local_a8.br.d;
              QVar6.d = local_a8.tl.d;
              local_a8.tl.d = (QPersistentModelIndexData *)local_158._0_8_;
              local_a8.br.d = (QPersistentModelIndexData *)local_158.i;
              local_158._0_8_ = QVar6.d;
              local_158.i = (quintptr)QVar7.d;
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_158.i);
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_158);
              QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,&local_a8.br);
              local_d8 = local_158.m.ptr;
              local_e8 = (QPersistentModelIndexData *)local_158._0_8_;
              pQStack_e0 = (QPersistentModelIndexData *)local_158.i;
              uVar17 = uVar16 - 1;
            }
          }
          else {
            if ((int)local_108 != (int)local_128) {
LAB_005a5b43:
              pQVar5 = (this->super_QAbstractItemViewPrivate).model;
              (**(code **)(*(long *)pQVar5 + 0x60))
                        (&local_158,pQVar5,(ulong)local_98 & 0xffffffff,0,&local_128);
              if ((int)local_108 == local_158.r) {
                if (((local_108._4_4_ == local_158.c) &&
                    (pQStack_100 == (QPersistentModelIndexData *)local_158.i)) &&
                   (local_f8 == local_158.m.ptr)) {
                  QtPrivate::QMovableArrayOps<QItemSelectionRange>::
                  emplace<QItemSelectionRange_const&>
                            ((QMovableArrayOps<QItemSelectionRange> *)&local_c8,local_c8.size,
                             &local_a8);
                  this_01 = &local_c8;
LAB_005a5e0a:
                  QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)this_01);
                  goto LAB_005a5e0f;
                }
              }
              goto LAB_005a5b9b;
            }
            if (((local_108._4_4_ != local_128._4_4_) || (pQStack_100 != pQStack_120)) ||
               (local_f8 != local_118)) goto LAB_005a5b43;
            uVar15 = (int)local_98 - (int)local_e8;
            uVar16 = -uVar15;
            if (0 < (int)uVar15) {
              uVar16 = uVar15;
            }
            if (uVar16 < 2) {
              local_158.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_158.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
              pQVar5 = (this->super_QAbstractItemViewPrivate).model;
              uVar11 = QPersistentModelIndex::row();
              uVar12 = QPersistentModelIndex::column();
              QPersistentModelIndex::parent();
              (**(code **)(*(long *)pQVar5 + 0x60))(&local_158,pQVar5,uVar11,uVar12,&local_178);
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_178._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_178.i = 0;
                local_178.m.ptr = (QAbstractItemModel *)0x0;
              }
              else if (local_e8._4_4_ == iVar3) {
                local_178.m.ptr = local_d8;
                local_178._0_8_ = local_e8;
                local_178.i = (quintptr)pQStack_e0;
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x70))
                          (&local_178,local_d8,(ulong)local_e8 & 0xffffffff,iVar3,&local_e8);
              }
            }
            else {
              bVar8 = QItemSelectionRange::isValid(&local_a8);
              if (bVar8) {
                QtPrivate::QMovableArrayOps<QItemSelectionRange>::
                emplace<QItemSelectionRange_const&>
                          ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,
                           &local_a8);
                this_01 = &local_58;
                goto LAB_005a5e0a;
              }
LAB_005a5e0f:
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_158._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_158.i = 0;
                local_158.m.ptr = (QAbstractItemModel *)0x0;
LAB_005a5f65:
                local_178._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_178.i = 0;
                local_178.m.ptr = (QAbstractItemModel *)0x0;
              }
              else {
                uVar19 = (ulong)local_e8 & 0xffffffff;
                if (local_e8._4_4_ == iVar2) {
                  local_158.m.ptr = local_d8;
                  local_158._0_8_ = local_e8;
                  local_158.i = (quintptr)pQStack_e0;
                }
                else {
                  (**(code **)(*(long *)local_d8 + 0x70))
                            (&local_158,local_d8,uVar19,iVar2,&local_e8);
                  if (local_d8 == (QAbstractItemModel *)0x0) goto LAB_005a5f65;
                  uVar19 = (ulong)local_e8 & 0xffffffff;
                }
                if (local_e8._4_4_ == iVar3) {
                  local_178.m.ptr = local_d8;
                  local_178._0_8_ = local_e8;
                  local_178.i = (quintptr)pQStack_e0;
                }
                else {
                  (**(code **)(*(long *)local_d8 + 0x70))
                            (&local_178,local_d8,uVar19,iVar3,&local_e8);
                }
              }
            }
            QPersistentModelIndex::QPersistentModelIndex(&local_138,&local_158);
            QPersistentModelIndex::QPersistentModelIndex(&QStack_130,&local_178);
            QVar7.d = local_a8.br.d;
            QVar6.d = local_a8.tl.d;
            local_a8.tl.d = local_138.d;
            local_a8.br.d = QStack_130.d;
            local_138.d = QVar6.d;
            QStack_130.d = QVar7.d;
            QPersistentModelIndex::~QPersistentModelIndex(&QStack_130);
            QPersistentModelIndex::~QPersistentModelIndex(&local_138);
          }
          pQStack_88 = local_d8;
          local_98 = local_e8;
          pQStack_90 = pQStack_e0;
          uVar16 = uVar17 + 1;
        } while ((int)uVar17 < iVar10);
      }
      bVar8 = QItemSelectionRange::isValid(&local_a8);
      if (bVar8) {
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_a8);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
      }
      if (local_c8.size != 0) {
        lVar18 = 0;
        uVar19 = 0;
        do {
          QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                    ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,
                     (QItemSelectionRange *)((long)&((local_c8.ptr)->tl).d + lVar18));
          QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
          uVar19 = uVar19 + 1;
          lVar18 = lVar18 + 0x10;
        } while (uVar19 < (ulong)local_c8.size);
      }
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_c8);
      QPersistentModelIndex::~QPersistentModelIndex(&local_a8.br);
      QPersistentModelIndex::~QPersistentModelIndex(&local_a8.tl);
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 != local_78.d.ptr + local_78.d.size);
  }
  pQVar13 = QAbstractItemView::selectionModel(this_00);
  (**(code **)(*(long *)pQVar13 + 0x70))(pQVar13,&local_58,(int)__writefds);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTreeViewPrivate::select(const QModelIndex &topIndex, const QModelIndex &bottomIndex,
                              QItemSelectionModel::SelectionFlags command)
{
    Q_Q(QTreeView);
    QItemSelection selection;
    const int top = viewIndex(topIndex),
        bottom = viewIndex(bottomIndex);

    const QList<std::pair<int, int>> colRanges = columnRanges(topIndex, bottomIndex);
    QList<std::pair<int, int>>::const_iterator it;
    for (it = colRanges.begin(); it != colRanges.end(); ++it) {
        const int left = (*it).first,
            right = (*it).second;

        QModelIndex previous;
        QItemSelectionRange currentRange;
        QStack<QItemSelectionRange> rangeStack;
        for (int i = top; i <= bottom; ++i) {
            QModelIndex index = modelIndex(i);
            QModelIndex parent = index.parent();
            QModelIndex previousParent = previous.parent();
            if (previous.isValid() && parent == previousParent) {
                // same parent
                if (qAbs(previous.row() - index.row()) > 1) {
                    //a hole (hidden index inside a range) has been detected
                    if (currentRange.isValid()) {
                        selection.append(currentRange);
                    }
                    //let's start a new range
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    QModelIndex tl = model->index(currentRange.top(), currentRange.left(),
                        currentRange.parent());
                    currentRange = QItemSelectionRange(tl, index.sibling(index.row(), right));
                }
            } else if (previous.isValid() && parent == model->index(previous.row(), 0, previousParent)) {
                // item is child of previous
                rangeStack.push(currentRange);
                currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
            } else {
                if (currentRange.isValid())
                    selection.append(currentRange);
                if (rangeStack.isEmpty()) {
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    currentRange = rangeStack.pop();
                    index = currentRange.bottomRight(); //let's resume the range
                    --i; //we process again the current item
                }
            }
            previous = index;
        }
        if (currentRange.isValid())
            selection.append(currentRange);
        for (int i = 0; i < rangeStack.size(); ++i)
            selection.append(rangeStack.at(i));
    }
    q->selectionModel()->select(selection, command);
}